

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O1

tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
__thiscall V4L2Device::decompress_jpeg(V4L2Device *this,v4l2_buffer *bufferinfo)

{
  Options *this_00;
  Logger *pLVar1;
  void *pvVar2;
  RawImage *__ptr;
  uint uVar3;
  undefined1 uVar4;
  int iVar5;
  pointer __p;
  OptionDetails *this_01;
  bool *pbVar6;
  Writer *pWVar7;
  size_t sVar8;
  long *plVar9;
  void *pvVar10;
  uint *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  bool bVar12;
  tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  tVar13;
  RawImagePtr image;
  uchar *buffer_array [1];
  jpeg_decompress_struct cinfo;
  JPEGErrorManager jerr;
  RawImage *local_4b0;
  undefined1 local_4a8 [32];
  char *local_488;
  VerboseLevel local_480;
  Logger *local_478;
  bool local_470;
  Logger *local_468;
  char *local_460;
  DispatchAction local_458;
  pointer local_450;
  pointer pbStack_448;
  pointer local_440;
  undefined8 local_438 [17];
  int local_3b0;
  uint local_3ac;
  int local_3a4;
  uint local_390;
  code *local_1a8 [2];
  code *local_198;
  undefined8 local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f8;
  __jmp_buf_tag local_f0;
  
  local_4b0 = (RawImage *)0x0;
  _Stack_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100 = *(undefined8 *)&bufferinfo[5].field_12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&_Stack_f8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(bufferinfo + 6));
  local_438[0] = jpeg_std_error(local_1a8);
  local_1a8[0] = jpeg_error_exit_cb;
  local_198 = jpeg_output_message_cb;
  iVar5 = _setjmp(&local_f0);
  if (iVar5 == 0) {
    jpeg_CreateDecompress(local_438,0x50,0x290);
    uVar11._0_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].type;
    uVar11._4_4_ = (&bufferinfo->timecode)[(ulong)*in_RDX - 2].flags;
    jpeg_mem_src(local_438,uVar11,in_RDX[0x12]);
    iVar5 = jpeg_read_header(local_438,1);
    if (iVar5 == 1) {
      jpeg_start_decompress(local_438);
      uVar3 = local_3ac;
      plVar9 = (long *)operator_new(0x10);
      __ptr = local_4b0;
      *plVar9 = 0;
      plVar9[1] = 0;
      local_4a8._0_8_ = (RawImage *)0x0;
      bVar12 = local_4b0 != (RawImage *)0x0;
      local_4b0 = (RawImage *)plVar9;
      if (bVar12) {
        std::default_delete<V4L2Device::RawImage>::operator()
                  ((default_delete<V4L2Device::RawImage> *)&local_4b0,__ptr);
      }
      if ((RawImage *)local_4a8._0_8_ != (RawImage *)0x0) {
        std::default_delete<V4L2Device::RawImage>::operator()
                  ((default_delete<V4L2Device::RawImage> *)local_4a8,(RawImage *)local_4a8._0_8_);
      }
      pvVar10 = operator_new__((ulong)(local_3a4 * local_3b0 * uVar3));
      pvVar2 = *(void **)local_4b0;
      *(void **)local_4b0 = pvVar10;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
      *(int *)((long)local_4b0 + 8) = local_3b0;
      *(uint *)((long)local_4b0 + 0xc) = uVar3;
      if (local_390 < local_3ac) {
        do {
          local_4a8._0_8_ = (ulong)(local_390 * local_3a4 * local_3b0) + *(long *)local_4b0;
          jpeg_read_scanlines(local_438,local_4a8,1);
        } while (local_390 < local_3ac);
      }
      jpeg_finish_decompress(local_438);
      jpeg_destroy_decompress(local_438);
      *(RawImage **)this = local_4b0;
      uVar4 = 1;
      uVar11 = extraout_RDX_00;
      goto LAB_001447e3;
    }
    local_4a8._0_8_ = &PTR__Writer_00164080;
    local_4a8._8_2_ = Error;
    local_4a8._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_4a8._24_8_ = 0x20e;
    local_488 = 
    "std::tuple<bool, RawImagePtr> V4L2Device::decompress_jpeg(const struct v4l2_buffer &)";
    local_480 = 0;
    local_478 = (Logger *)0x0;
    local_470 = false;
    local_468 = (Logger *)0x0;
    local_460 = "";
    local_458 = NormalLog;
    local_450 = (pointer)0x0;
    pbStack_448 = (pointer)0x0;
    local_440 = (pointer)0x0;
    pWVar7 = el::base::Writer::construct((Writer *)local_4a8,1,"default");
    if (pWVar7->m_proceed == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50,"broken JPEG",0xb);
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer((Writer *)local_4a8);
    uVar11 = extraout_RDX_01;
  }
  else {
    this_00 = *(Options **)&bufferinfo[5].field_12;
    local_4a8._0_8_ = (RawImage *)(local_4a8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"quiet","");
    this_01 = cxxopts::Options::operator[](this_00,(string *)local_4a8);
    pbVar6 = cxxopts::OptionDetails::as<bool>(this_01);
    bVar12 = *pbVar6;
    if ((RawImage *)local_4a8._0_8_ != (RawImage *)(local_4a8 + 0x10)) {
      operator_delete((void *)local_4a8._0_8_);
    }
    if (bVar12 == false) {
      local_4a8._0_8_ = &PTR__Writer_00164080;
      local_4a8._8_2_ = Warning;
      local_4a8._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_4a8._24_8_ = 0x1ff;
      local_488 = 
      "std::tuple<bool, RawImagePtr> V4L2Device::decompress_jpeg(const struct v4l2_buffer &)";
      local_480 = 0;
      local_478 = (Logger *)0x0;
      local_470 = false;
      local_468 = (Logger *)0x0;
      local_460 = "";
      local_458 = NormalLog;
      local_450 = (pointer)0x0;
      pbStack_448 = (pointer)0x0;
      local_440 = (pointer)0x0;
      pWVar7 = el::base::Writer::construct((Writer *)local_4a8,1,"default");
      if (pWVar7->m_proceed == true) {
        pLVar1 = (pWVar7->m_messageBuilder).m_logger;
        sVar8 = strlen(jpeg_last_error_msg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pLVar1->field_0x50,jpeg_last_error_msg,sVar8);
        if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar7->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
      }
      el::base::Writer::~Writer((Writer *)local_4a8);
    }
    jpeg_destroy_decompress(local_438);
    uVar11 = extraout_RDX;
  }
  *(RawImage **)this = local_4b0;
  uVar4 = 0;
LAB_001447e3:
  local_4b0 = (RawImage *)0x0;
  *(undefined1 *)&(this->buffers)._M_elems[0].start = uVar4;
  if (_Stack_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f8._M_pi);
    uVar11 = extraout_RDX_02;
  }
  if (local_4b0 != (RawImage *)0x0) {
    std::default_delete<V4L2Device::RawImage>::operator()
              ((default_delete<V4L2Device::RawImage> *)&local_4b0,local_4b0);
    uVar11 = extraout_RDX_03;
  }
  tVar13.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ._8_8_ = uVar11;
  tVar13.
  super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Tuple_impl<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>._M_t.
  super__Tuple_impl<0UL,_V4L2Device::RawImage_*,_std::default_delete<V4L2Device::RawImage>_>.
  super__Head_base<0UL,_V4L2Device::RawImage_*,_false>._M_head_impl =
       (_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
        )(_Head_base<1UL,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>,_false>
          )this;
  return (tuple<bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
          )tVar13.
           super__Tuple_impl<0UL,_bool,_std::unique_ptr<V4L2Device::RawImage,_std::default_delete<V4L2Device::RawImage>_>_>
  ;
}

Assistant:

std::tuple<bool, RawImagePtr>
    decompress_jpeg(const struct v4l2_buffer& bufferinfo)
    {
        struct jpeg_decompress_struct cinfo;
        RawImagePtr image;

        JPEGErrorManager jerr;
        jerr.options = options;
        cinfo.err = jpeg_std_error(&jerr.pub);
        jerr.pub.error_exit = jpeg_error_exit_cb;
        jerr.pub.output_message = jpeg_output_message_cb;

        if (setjmp(jerr.setjmp_buffer)) {
            // If we get here, the JPEG code has signaled an error.
            auto quiet = (*options)["quiet"].as<bool>();
            if (not quiet) {
                LOG(WARNING) << jpeg_last_error_msg;
            }

            jpeg_destroy_decompress(&cinfo);

            return std::make_tuple(false, std::move(image));
        }

        jpeg_create_decompress(&cinfo);

        auto idx = bufferinfo.index;
        jpeg_mem_src(&cinfo, static_cast<unsigned char*>(buffers[idx].start), bufferinfo.length);

        auto rc = jpeg_read_header(&cinfo, TRUE);
        if (rc != 1) {
            LOG(ERROR) << "broken JPEG";
            return std::make_tuple(false, std::move(image));
        }

        jpeg_start_decompress(&cinfo);

        auto width = cinfo.output_width;
        auto height = cinfo.output_height;
        auto pixel_size = cinfo.output_components;
        auto row_stride = width * pixel_size;
        auto raw_size = width * height * pixel_size;

        image = RawImagePtr(new RawImage);

        image->raw_data = MemBufferPtr(new unsigned char[raw_size]);
        image->width = width;
        image->height = height;

        while (cinfo.output_scanline < cinfo.output_height) {
            unsigned char* buffer_array[1];
            buffer_array[0] = image->raw_data.get() + (cinfo.output_scanline) * row_stride;
            jpeg_read_scanlines(&cinfo, buffer_array, 1);
        }

        jpeg_finish_decompress(&cinfo);
        jpeg_destroy_decompress(&cinfo);

        return std::make_tuple(true, std::move(image));
    }